

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonAppendString(JsonString *p,char *zIn,u32 N)

{
  u8 c;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  u8 *z;
  u64 uVar6;
  
  if (zIn == (char *)0x0) {
    return;
  }
  uVar6 = p->nUsed;
  if (p->nAlloc <= N + uVar6 + 2) {
    iVar1 = jsonStringGrow(p,N + 2);
    if (iVar1 != 0) {
      return;
    }
    uVar6 = p->nUsed;
  }
  p->nUsed = uVar6 + 1;
  p->zBuf[uVar6] = '\"';
  do {
    uVar4 = 0;
    while( true ) {
      uVar2 = uVar4 + 3;
      uVar5 = (ulong)uVar4;
      if (N <= uVar2) break;
      uVar3 = uVar4;
      if (""[((u8 *)zIn)[uVar5]] == '\0') goto LAB_001a5817;
      uVar5 = (ulong)(uVar4 + 1);
      if ((""[((u8 *)zIn)[uVar5]] == '\0') ||
         (uVar5 = (ulong)(uVar4 + 2), ""[((u8 *)zIn)[uVar5]] == '\0')) goto LAB_001a5811;
      uVar3 = uVar2;
      if (""[((u8 *)zIn)[uVar2]] == '\0') goto LAB_001a5817;
      uVar4 = uVar4 + 4;
    }
    while( true ) {
      if (N <= uVar5) {
        if (uVar4 < N) {
          uVar4 = N;
        }
        goto LAB_001a5908;
      }
      if (""[((u8 *)zIn)[uVar5]] == '\0') break;
      uVar5 = uVar5 + 1;
    }
LAB_001a5811:
    uVar3 = (uint)uVar5;
LAB_001a5817:
    uVar4 = uVar3;
    if (N < uVar3 || N - uVar3 == 0) {
LAB_001a5908:
      uVar6 = p->nUsed;
      if (uVar4 != 0) {
        memcpy(p->zBuf + uVar6,zIn,(ulong)uVar4);
        uVar6 = (ulong)uVar4 + p->nUsed;
      }
      p->nUsed = uVar6 + 1;
      p->zBuf[uVar6] = '\"';
      return;
    }
    if (uVar3 != 0) {
      uVar5 = (ulong)uVar3;
      memcpy(p->zBuf + p->nUsed,zIn,uVar5);
      p->nUsed = p->nUsed + uVar5;
      zIn = (char *)((u8 *)zIn + uVar5);
      N = N - uVar3;
    }
    c = *zIn;
    if (c == '\\') {
LAB_001a585f:
      uVar6 = p->nUsed;
      if (p->nAlloc < N + uVar6 + 3) {
        iVar1 = jsonStringGrow(p,N + 3);
        if (iVar1 != 0) {
          return;
        }
        uVar6 = p->nUsed;
      }
      p->nUsed = uVar6 + 1;
      p->zBuf[uVar6] = '\\';
      uVar6 = p->nUsed;
      p->nUsed = uVar6 + 1;
      p->zBuf[uVar6] = c;
    }
    else if (c == '\'') {
      uVar6 = p->nUsed;
      p->nUsed = uVar6 + 1;
      p->zBuf[uVar6] = '\'';
    }
    else {
      if (c == '\"') goto LAB_001a585f;
      if ((p->nAlloc < (ulong)N + p->nUsed + 7) && (iVar1 = jsonStringGrow(p,N + 7), iVar1 != 0)) {
        return;
      }
      jsonAppendControlChar(p,c);
    }
    zIn = (char *)((u8 *)zIn + 1);
    N = N - 1;
  } while( true );
}

Assistant:

static void jsonAppendString(JsonString *p, const char *zIn, u32 N){
  u32 k;
  u8 c;
  const u8 *z = (const u8*)zIn;
  if( z==0 ) return;
  if( (N+p->nUsed+2 >= p->nAlloc) && jsonStringGrow(p,N+2)!=0 ) return;
  p->zBuf[p->nUsed++] = '"';
  while( 1 /*exit-by-break*/ ){
    k = 0;
    /* The following while() is the 4-way unwound equivalent of
    **
    **     while( k<N && jsonIsOk[z[k]] ){ k++; }
    */
    while( 1 /* Exit by break */ ){
      if( k+3>=N ){
        while( k<N && jsonIsOk[z[k]] ){ k++; }
        break;
      }
      if( !jsonIsOk[z[k]] ){
        break;
      }
      if( !jsonIsOk[z[k+1]] ){
        k += 1;
        break;
      }
      if( !jsonIsOk[z[k+2]] ){
        k += 2;
        break;
      }
      if( !jsonIsOk[z[k+3]] ){
        k += 3;
        break;
      }else{
        k += 4;
      }
    }
    if( k>=N ){
      if( k>0 ){
        memcpy(&p->zBuf[p->nUsed], z, k);
        p->nUsed += k;
      }
      break;
    }
    if( k>0 ){
      memcpy(&p->zBuf[p->nUsed], z, k);
      p->nUsed += k;
      z += k;
      N -= k;
    }
    c = z[0];
    if( c=='"' || c=='\\' ){
      if( (p->nUsed+N+3 > p->nAlloc) && jsonStringGrow(p,N+3)!=0 ) return;
      p->zBuf[p->nUsed++] = '\\';
      p->zBuf[p->nUsed++] = c;
    }else if( c=='\'' ){
      p->zBuf[p->nUsed++] = c;
    }else{
      if( (p->nUsed+N+7 > p->nAlloc) && jsonStringGrow(p,N+7)!=0 ) return;
      jsonAppendControlChar(p, c);
    }
    z++;
    N--;
  }
  p->zBuf[p->nUsed++] = '"';
  assert( p->nUsed<p->nAlloc );
}